

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O2

ref<aphy::engine> aphy::makeObjectWithInterface<aphy::engine,APhyBullet::BulletEngine>(void)

{
  pointer __p;
  aphyGetEngines_FUN p_Var1;
  aphy_icd_dispatch *paVar2;
  Counter *in_RDI;
  __uniq_ptr_impl<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
  local_18;
  
  p_Var1 = (aphyGetEngines_FUN)::operator_new(0x10);
  *(undefined ***)p_Var1 = &PTR__BulletEngine_001eb770;
  paVar2 = (aphy_icd_dispatch *)::operator_new(0x18);
  *(undefined1 **)paVar2 = cppRefcountedDispatchTable;
  paVar2->aphyGetEngines = p_Var1;
  paVar2->aphyAddEngineReference = (aphyAddEngineReference_FUN)0x1;
  *(aphy_icd_dispatch **)(p_Var1 + 8) = paVar2;
  local_18._M_t.
  super__Tuple_impl<0UL,_aphy::ref_counter<aphy::engine>_*,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
  .super__Head_base<0UL,_aphy::ref_counter<aphy::engine>_*,_false>._M_head_impl =
       (tuple<aphy::ref_counter<aphy::engine>_*,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
        )(_Tuple_impl<0UL,_aphy::ref_counter<aphy::engine>_*,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
          )0x0;
  in_RDI->dispatchTable = paVar2;
  std::
  unique_ptr<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::engine>,_std::default_delete<aphy::ref_counter<aphy::engine>_>_>
                 *)&local_18);
  return (ref<aphy::engine>)in_RDI;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}